

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_optimizations.cpp
# Opt level: O1

LikeString * duckdb::LikeMatchFromRegex(LikeString *__return_storage_ptr__,RE2 *pattern)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Regexp *pRVar2;
  pointer pcVar3;
  ulong uVar4;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  ulong uVar6;
  LikeString ret;
  undefined2 local_68;
  _Alloc_hider _Stack_60;
  size_type local_58;
  size_type sStack_50;
  undefined8 local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  ulong local_38;
  
  _Stack_60._M_p = (pointer)&sStack_50;
  local_48 = 0;
  local_68 = 1;
  local_58 = 0;
  sStack_50 = 0;
  pRVar2 = pattern->entire_regexp_;
  uVar6 = (ulong)pRVar2->nsub_;
  if (uVar6 < 2) {
    paVar5 = &pRVar2->field_5;
  }
  else {
    paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar2->field_5).submany_;
  }
  if (uVar6 != 0) {
    local_40 = &(__return_storage_ptr__->like_string).field_2;
    local_38 = uVar6 - 1;
    uVar4 = 0;
    do {
      pRVar2 = paVar5[uVar4].subone_;
      switch(pRVar2->op_) {
      case '\x02':
        break;
      case '\x03':
      case '\x04':
        if (uVar4 == 0) {
          ::std::__cxx11::string::append((char *)&_Stack_60);
        }
        GetLikeStringEscaped(__return_storage_ptr__,paVar5[uVar4].subone_,false);
        if (__return_storage_ptr__->exists != true) goto LAB_01176ff1;
        ::std::__cxx11::string::_M_append
                  ((char *)&_Stack_60,(ulong)(__return_storage_ptr__->like_string)._M_dataplus._M_p)
        ;
        local_68 = CONCAT11(__return_storage_ptr__->escaped,(undefined1)local_68);
        if (local_38 == uVar4) {
          ::std::__cxx11::string::append((char *)&_Stack_60);
        }
        pcVar3 = (__return_storage_ptr__->like_string)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != local_40) {
          operator_delete(pcVar3);
        }
        break;
      case '\x05':
      case '\x06':
      case '\b':
      case '\t':
      case '\n':
      case '\v':
switchD_01176eca_caseD_5:
        local_68 = local_68 & 0xff00;
        __return_storage_ptr__->exists = (bool)(undefined1)local_68;
        __return_storage_ptr__->escaped = (bool)local_68._1_1_;
        (__return_storage_ptr__->like_string)._M_dataplus._M_p = (pointer)local_40;
        if ((size_type *)_Stack_60._M_p == &sStack_50) {
          local_40->_M_allocated_capacity = sStack_50;
          *(undefined8 *)((long)local_40 + 8) = local_48;
          goto LAB_01176fd5;
        }
        (__return_storage_ptr__->like_string)._M_dataplus._M_p = _Stack_60._M_p;
        goto LAB_01176fc4;
      case '\a':
        if ((pRVar2->nsub_ != 1) || (((pRVar2->field_5).subone_)->op_ != '\f'))
        goto switchD_01176eca_caseD_5;
LAB_01176f87:
        ::std::__cxx11::string::append((char *)&_Stack_60);
        break;
      case '\f':
        if (uVar4 == 0) {
          ::std::__cxx11::string::append((char *)&_Stack_60);
        }
        ::std::__cxx11::string::append((char *)&_Stack_60);
        if (local_38 == uVar4) goto LAB_01176f87;
        break;
      default:
        if (1 < pRVar2->op_ - 0x12) goto switchD_01176eca_caseD_5;
      }
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
  }
  __return_storage_ptr__->exists = (bool)(char)local_68;
  __return_storage_ptr__->escaped = (bool)(char)(local_68 >> 8);
  paVar1 = &(__return_storage_ptr__->like_string).field_2;
  (__return_storage_ptr__->like_string)._M_dataplus._M_p = (pointer)paVar1;
  if ((size_type *)_Stack_60._M_p == &sStack_50) {
    paVar1->_M_allocated_capacity = sStack_50;
    *(undefined8 *)((long)&(__return_storage_ptr__->like_string).field_2 + 8) = local_48;
  }
  else {
    (__return_storage_ptr__->like_string)._M_dataplus._M_p = _Stack_60._M_p;
LAB_01176fc4:
    (__return_storage_ptr__->like_string).field_2._M_allocated_capacity = sStack_50;
  }
LAB_01176fd5:
  _Stack_60._M_p = (pointer)&sStack_50;
  (__return_storage_ptr__->like_string)._M_string_length = local_58;
  local_58 = 0;
  sStack_50 = sStack_50 & 0xffffffffffffff00;
LAB_01176ff1:
  if ((size_type *)_Stack_60._M_p != &sStack_50) {
    operator_delete(_Stack_60._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static LikeString LikeMatchFromRegex(duckdb_re2::RE2 &pattern) {
	LikeString ret = LikeString();
	auto num_subs = pattern.Regexp()->nsub();
	auto subs = pattern.Regexp()->sub();
	auto cur_sub_index = 0;
	while (cur_sub_index < num_subs) {
		switch (subs[cur_sub_index]->op()) {
		case duckdb_re2::kRegexpAnyChar:
			if (cur_sub_index == 0) {
				ret.like_string += "%";
			}
			ret.like_string += "_";
			if (cur_sub_index + 1 == num_subs) {
				ret.like_string += "%";
			}
			break;
		case duckdb_re2::kRegexpStar:
			// .* is a Star operator is a anyChar operator as a child.
			// any other child operator would represent a pattern LIKE cannot match.
			if (subs[cur_sub_index]->nsub() == 1 && subs[cur_sub_index]->sub()[0]->op() == duckdb_re2::kRegexpAnyChar) {
				ret.like_string += "%";
				break;
			}
			ret.exists = false;
			return ret;
		case duckdb_re2::kRegexpLiteralString:
		case duckdb_re2::kRegexpLiteral: {
			// if this is the only matching op, we should have directly called
			// GetEscapedLikeString
			D_ASSERT(!(cur_sub_index == 0 && cur_sub_index + 1 == num_subs));
			if (cur_sub_index == 0) {
				ret.like_string += "%";
			}
			// if the kRegexpLiteral or kRegexpLiteralString is the only op to match
			// the string can directly be converted into a contains
			LikeString escaped_like_string = GetLikeStringEscaped(subs[cur_sub_index], false);
			if (!escaped_like_string.exists) {
				return escaped_like_string;
			}
			ret.like_string += escaped_like_string.like_string;
			ret.escaped = escaped_like_string.escaped;
			if (cur_sub_index + 1 == num_subs) {
				ret.like_string += "%";
			}
			break;
		}
		case duckdb_re2::kRegexpEndText:
		case duckdb_re2::kRegexpEmptyMatch:
		case duckdb_re2::kRegexpBeginText: {
			break;
		}
		default:
			// some other regexp op that doesn't have an equivalent to a like string
			// return false;
			ret.exists = false;
			return ret;
		}
		cur_sub_index += 1;
	}
	return ret;
}